

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderMultisampleInterpolationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::ShaderMultisampleInterpolationTests::init
          (ShaderMultisampleInterpolationTests *this,EVP_PKEY_CTX *ctx)

{
  Context *pCVar1;
  TestNode *pTVar2;
  TestNode *pTVar3;
  long lVar4;
  InterpolateAtSampleRenderCase *pIVar5;
  SingleSampleInterpolateAtSampleCase *pSVar6;
  char *pcVar7;
  NegativeCompileInterpolationCase *pNVar8;
  InterpolateAtCentroidCase *pIVar9;
  InterpolateAtOffsetCase *pIVar10;
  TestNode *node;
  ulong extraout_RAX;
  ulong uVar11;
  uint local_164;
  int ndx_2;
  TestCaseGroup *group_11;
  int targetNdx_11;
  TestCaseGroup *group_10;
  int targetNdx_10;
  TestCaseGroup *group_9;
  int targetNdx_9;
  TestCaseGroup *qualifierGroup;
  int configNdx;
  TestCaseGroup *methodGroup_1;
  int ndx_1;
  TestCaseGroup *group_8;
  int targetNdx_8;
  TestCaseGroup *group_7;
  int targetNdx_7;
  TestCaseGroup *group_6;
  TestCaseGroup *methodGroup;
  int ndx;
  TestCaseGroup *group_5;
  int targetNdx_6;
  TestCaseGroup *group_4;
  int targetNdx_5;
  TestCaseGroup *group_3;
  string local_a8 [32];
  int local_88;
  undefined1 local_82;
  allocator<char> local_81;
  int targetNdx_4;
  int local_5c;
  TestNode *pTStack_58;
  int targetNdx_3;
  TestCaseGroup *group_2;
  TestNode *pTStack_48;
  int targetNdx_2;
  TestCaseGroup *group_1;
  TestNode *pTStack_38;
  int targetNdx_1;
  TestCaseGroup *group;
  TestCaseGroup *interpolateAtSampleGroup;
  int targetNdx;
  TestNode *local_18;
  TestCaseGroup *sampleQualifierGroup;
  ShaderMultisampleInterpolationTests *this_local;
  
  sampleQualifierGroup = (TestCaseGroup *)this;
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "sample_qualifier","Test sample qualifier");
  local_18 = pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (interpolateAtSampleGroup._0_4_ = 0; pTVar2 = local_18, (int)interpolateAtSampleGroup < 0xd;
      interpolateAtSampleGroup._0_4_ = (int)interpolateAtSampleGroup + 1) {
    pTVar3 = (TestNode *)operator_new(0x128);
    lVar4 = (long)(int)interpolateAtSampleGroup;
    anon_unknown_2::SampleQualifierRenderCase::SampleQualifierRenderCase
              ((SampleQualifierRenderCase *)pTVar3,(this->super_TestCaseGroup).m_context,
               init::targets[lVar4].name,init::targets[lVar4].desc,init::targets[lVar4].numSamples,
               init::targets[lVar4].target);
    tcu::TestNode::addChild(pTVar2,pTVar3);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolate_at_sample","Test interpolateAtSample");
  group = (TestCaseGroup *)pTVar2;
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "static_sample_number","Test interpolateAtSample sample number");
  pTStack_38 = pTVar2;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  for (group_1._4_4_ = 0; pTVar2 = pTStack_38, group_1._4_4_ < 0xd;
      group_1._4_4_ = group_1._4_4_ + 1) {
    pIVar5 = (InterpolateAtSampleRenderCase *)operator_new(0x130);
    lVar4 = (long)group_1._4_4_;
    anon_unknown_2::InterpolateAtSampleRenderCase::InterpolateAtSampleRenderCase
              (pIVar5,(this->super_TestCaseGroup).m_context,init::targets[lVar4].name,
               init::targets[lVar4].desc,init::targets[lVar4].numSamples,init::targets[lVar4].target
               ,INDEXING_STATIC);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "dynamic_sample_number","Test interpolateAtSample sample number");
  pTStack_48 = pTVar2;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  for (group_2._4_4_ = 0; pTVar2 = pTStack_48, group_2._4_4_ < 0xd;
      group_2._4_4_ = group_2._4_4_ + 1) {
    pIVar5 = (InterpolateAtSampleRenderCase *)operator_new(0x130);
    lVar4 = (long)group_2._4_4_;
    anon_unknown_2::InterpolateAtSampleRenderCase::InterpolateAtSampleRenderCase
              (pIVar5,(this->super_TestCaseGroup).m_context,init::targets[lVar4].name,
               init::targets[lVar4].desc,init::targets[lVar4].numSamples,init::targets[lVar4].target
               ,INDEXING_DYNAMIC);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pIVar5);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "non_multisample_buffer","Test interpolateAtSample with non-multisample buffers");
  pTStack_58 = pTVar2;
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  for (local_5c = 0; pTVar2 = pTStack_58, local_5c < 0xd; local_5c = local_5c + 1) {
    if (init::targets[local_5c].numSamples == 0) {
      pSVar6 = (SingleSampleInterpolateAtSampleCase *)operator_new(0x130);
      local_82 = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&targetNdx_4,"sample_0_",&local_81);
      std::__cxx11::string::append((char *)&targetNdx_4);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      lVar4 = (long)local_5c;
      anon_unknown_2::SingleSampleInterpolateAtSampleCase::SingleSampleInterpolateAtSampleCase
                (pSVar6,pCVar1,pcVar7,init::targets[lVar4].desc,init::targets[lVar4].numSamples,
                 init::targets[lVar4].target,SAMPLE_0);
      local_82 = 0;
      tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar6);
      std::__cxx11::string::~string((string *)&targetNdx_4);
      std::allocator<char>::~allocator(&local_81);
    }
  }
  for (local_88 = 0; pTVar2 = pTStack_58, local_88 < 0xd; local_88 = local_88 + 1) {
    if (init::targets[local_88].numSamples == 0) {
      pSVar6 = (SingleSampleInterpolateAtSampleCase *)operator_new(0x130);
      group_3._6_1_ = 1;
      pCVar1 = (this->super_TestCaseGroup).m_context;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_a8,"sample_n_",(allocator<char> *)((long)&group_3 + 7));
      std::__cxx11::string::append((char *)local_a8);
      pcVar7 = (char *)std::__cxx11::string::c_str();
      lVar4 = (long)local_88;
      anon_unknown_2::SingleSampleInterpolateAtSampleCase::SingleSampleInterpolateAtSampleCase
                (pSVar6,pCVar1,pcVar7,init::targets[lVar4].desc,init::targets[lVar4].numSamples,
                 init::targets[lVar4].target,SAMPLE_N);
      group_3._6_1_ = 0;
      tcu::TestNode::addChild(pTVar2,(TestNode *)pSVar6);
      std::__cxx11::string::~string(local_a8);
      std::allocator<char>::~allocator((allocator<char> *)((long)&group_3 + 7));
    }
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "centroid_qualified","Test interpolateAtSample with centroid qualified varying");
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  for (group_4._4_4_ = 0; group_4._4_4_ < 0xd; group_4._4_4_ = group_4._4_4_ + 1) {
    pTVar3 = (TestNode *)operator_new(0x128);
    lVar4 = (long)group_4._4_4_;
    anon_unknown_2::CentroidQualifierAtSampleCase::CentroidQualifierAtSampleCase
              ((CentroidQualifierAtSampleCase *)pTVar3,(this->super_TestCaseGroup).m_context,
               init::targets[lVar4].name,init::targets[lVar4].desc,init::targets[lVar4].numSamples,
               init::targets[lVar4].target);
    tcu::TestNode::addChild(pTVar2,pTVar3);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"at_sample_id"
             ,"Test interpolateAtSample at current sample id");
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  for (group_5._4_4_ = 0; group_5._4_4_ < 0xd; group_5._4_4_ = group_5._4_4_ + 1) {
    pTVar3 = (TestNode *)operator_new(0x128);
    lVar4 = (long)group_5._4_4_;
    anon_unknown_2::InterpolateAtSampleIDCase::InterpolateAtSampleIDCase
              ((InterpolateAtSampleIDCase *)pTVar3,(this->super_TestCaseGroup).m_context,
               init::targets[lVar4].name,init::targets[lVar4].desc,init::targets[lVar4].numSamples,
               init::targets[lVar4].target);
    tcu::TestNode::addChild(pTVar2,pTVar3);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "interpolateAtSample negative tests");
  tcu::TestNode::addChild(&group->super_TestNode,pTVar2);
  for (methodGroup._4_4_ = 0; methodGroup._4_4_ < 0xb; methodGroup._4_4_ = methodGroup._4_4_ + 1) {
    pNVar8 = (NegativeCompileInterpolationCase *)operator_new(0x80);
    lVar4 = (long)methodGroup._4_4_;
    anon_unknown_2::NegativeCompileInterpolationCase::NegativeCompileInterpolationCase
              (pNVar8,(this->super_TestCaseGroup).m_context,init::negativeCompileCases[lVar4].name,
               init::negativeCompileCases[lVar4].description,
               init::negativeCompileCases[lVar4].caseType,INTERPOLATE_AT_SAMPLE);
    tcu::TestNode::addChild(pTVar2,(TestNode *)pNVar8);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolate_at_centroid","Test interpolateAtCentroid");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"consistency",
             "Test interpolateAtCentroid return value is consistent to centroid qualified value");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (group_7._4_4_ = 0; group_7._4_4_ < 0xd; group_7._4_4_ = group_7._4_4_ + 1) {
    pIVar9 = (InterpolateAtCentroidCase *)operator_new(0x130);
    lVar4 = (long)group_7._4_4_;
    anon_unknown_2::InterpolateAtCentroidCase::InterpolateAtCentroidCase
              (pIVar9,(this->super_TestCaseGroup).m_context,init::targets[lVar4].name,
               init::targets[lVar4].desc,init::targets[lVar4].numSamples,init::targets[lVar4].target
               ,TEST_CONSISTENCY);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "array_element","Test interpolateAtCentroid with array element");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (group_8._4_4_ = 0; group_8._4_4_ < 0xd; group_8._4_4_ = group_8._4_4_ + 1) {
    pIVar9 = (InterpolateAtCentroidCase *)operator_new(0x130);
    lVar4 = (long)group_8._4_4_;
    anon_unknown_2::InterpolateAtCentroidCase::InterpolateAtCentroidCase
              (pIVar9,(this->super_TestCaseGroup).m_context,init::targets[lVar4].name,
               init::targets[lVar4].desc,init::targets[lVar4].numSamples,init::targets[lVar4].target
               ,TEST_ARRAY_ELEMENT);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar9);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "interpolateAtCentroid negative tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (methodGroup_1._4_4_ = 0; methodGroup_1._4_4_ < 0xb;
      methodGroup_1._4_4_ = methodGroup_1._4_4_ + 1) {
    pNVar8 = (NegativeCompileInterpolationCase *)operator_new(0x80);
    lVar4 = (long)methodGroup_1._4_4_;
    anon_unknown_2::NegativeCompileInterpolationCase::NegativeCompileInterpolationCase
              (pNVar8,(this->super_TestCaseGroup).m_context,init::negativeCompileCases[lVar4].name,
               init::negativeCompileCases[lVar4].description,
               init::negativeCompileCases[lVar4].caseType,INTERPOLATE_AT_CENTROID);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pNVar8);
  }
  pTVar2 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar2,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "interpolate_at_offset","Test interpolateAtOffset");
  tcu::TestNode::addChild((TestNode *)this,pTVar2);
  for (qualifierGroup._4_4_ = 0; qualifierGroup._4_4_ < 3;
      qualifierGroup._4_4_ = qualifierGroup._4_4_ + 1) {
    pTVar3 = (TestNode *)operator_new(0x70);
    tcu::TestCaseGroup::TestCaseGroup
              ((TestCaseGroup *)pTVar3,
               (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               init::configs[qualifierGroup._4_4_].name,
               "Test interpolateAtOffset with qualified/non-qualified varying");
    tcu::TestNode::addChild(pTVar2,pTVar3);
    for (group_9._4_4_ = 0; group_9._4_4_ < 0xd; group_9._4_4_ = group_9._4_4_ + 1) {
      pIVar10 = (InterpolateAtOffsetCase *)operator_new(0x130);
      lVar4 = (long)group_9._4_4_;
      anon_unknown_2::InterpolateAtOffsetCase::InterpolateAtOffsetCase
                (pIVar10,(this->super_TestCaseGroup).m_context,init::targets[lVar4].name,
                 init::targets[lVar4].desc,init::targets[lVar4].numSamples,
                 init::targets[lVar4].target,init::configs[qualifierGroup._4_4_].type);
      tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar10);
    }
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "at_sample_position","Test interpolateAtOffset at sample position");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (group_10._4_4_ = 0; group_10._4_4_ < 0xd; group_10._4_4_ = group_10._4_4_ + 1) {
    node = (TestNode *)operator_new(0x128);
    lVar4 = (long)group_10._4_4_;
    anon_unknown_2::InterpolateAtSamplePositionCase::InterpolateAtSamplePositionCase
              ((InterpolateAtSamplePositionCase *)node,(this->super_TestCaseGroup).m_context,
               init::targets[lVar4].name,init::targets[lVar4].desc,init::targets[lVar4].numSamples,
               init::targets[lVar4].target);
    tcu::TestNode::addChild(pTVar3,node);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "array_element","Test interpolateAtOffset with array element");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  for (group_11._4_4_ = 0; group_11._4_4_ < 0xd; group_11._4_4_ = group_11._4_4_ + 1) {
    pIVar10 = (InterpolateAtOffsetCase *)operator_new(0x130);
    lVar4 = (long)group_11._4_4_;
    anon_unknown_2::InterpolateAtOffsetCase::InterpolateAtOffsetCase
              (pIVar10,(this->super_TestCaseGroup).m_context,init::targets[lVar4].name,
               init::targets[lVar4].desc,init::targets[lVar4].numSamples,init::targets[lVar4].target
               ,TEST_ARRAY_ELEMENT);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pIVar10);
  }
  pTVar3 = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)pTVar3,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,"negative",
             "interpolateAtOffset negative tests");
  tcu::TestNode::addChild(pTVar2,pTVar3);
  local_164 = 0;
  uVar11 = extraout_RAX;
  while ((int)local_164 < 0xb) {
    pNVar8 = (NegativeCompileInterpolationCase *)operator_new(0x80);
    lVar4 = (long)(int)local_164;
    anon_unknown_2::NegativeCompileInterpolationCase::NegativeCompileInterpolationCase
              (pNVar8,(this->super_TestCaseGroup).m_context,init::negativeCompileCases[lVar4].name,
               init::negativeCompileCases[lVar4].description,
               init::negativeCompileCases[lVar4].caseType,INTERPOLATE_AT_OFFSET);
    tcu::TestNode::addChild(pTVar3,(TestNode *)pNVar8);
    local_164 = local_164 + 1;
    uVar11 = (ulong)local_164;
  }
  return (int)uVar11;
}

Assistant:

void ShaderMultisampleInterpolationTests::init (void)
{
	using namespace MultisampleShaderRenderUtil;

	static const struct RenderTarget
	{
		const char*							name;
		const char*							desc;
		int									numSamples;
		MultisampleRenderCase::RenderTarget	target;
	} targets[] =
	{
		{ "default_framebuffer",		"Test with default framebuffer",	0,	MultisampleRenderCase::TARGET_DEFAULT		},
		{ "singlesample_texture",		"Test with singlesample texture",	0,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_1",		"Test with multisample texture",	1,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_2",		"Test with multisample texture",	2,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_4",		"Test with multisample texture",	4,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_8",		"Test with multisample texture",	8,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "multisample_texture_16",		"Test with multisample texture",	16,	MultisampleRenderCase::TARGET_TEXTURE		},
		{ "singlesample_rbo",			"Test with singlesample rbo",		0,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_1",			"Test with multisample rbo",		1,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_2",			"Test with multisample rbo",		2,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_4",			"Test with multisample rbo",		4,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_8",			"Test with multisample rbo",		8,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
		{ "multisample_rbo_16",			"Test with multisample rbo",		16,	MultisampleRenderCase::TARGET_RENDERBUFFER	},
	};

	static const struct
	{
		const char*									name;
		const char*									description;
		NegativeCompileInterpolationCase::CaseType	caseType;
	} negativeCompileCases[] =
	{
		{ "vec4_identity_swizzle",		"use identity swizzle",				NegativeCompileInterpolationCase::CASE_VEC4_IDENTITY_SWIZZLE		},
		{ "vec4_crop_swizzle",			"use cropped identity swizzle",		NegativeCompileInterpolationCase::CASE_VEC4_CROP_SWIZZLE			},
		{ "vec4_mixed_swizzle",			"use swizzle",						NegativeCompileInterpolationCase::CASE_VEC4_MIXED_SWIZZLE			},
		{ "interpolate_ivec4",			"interpolate integer variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_IVEC4			},
		{ "interpolate_uvec4",			"interpolate integer variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_UVEC4			},
		{ "interpolate_array",			"interpolate whole array",			NegativeCompileInterpolationCase::CASE_INTERPOLATE_ARRAY			},
		{ "interpolate_struct",			"interpolate whole struct",			NegativeCompileInterpolationCase::CASE_INTERPOLATE_STRUCT			},
		{ "interpolate_struct_member",	"interpolate struct member",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_STRUCT_MEMBER	},
		{ "interpolate_local",			"interpolate local variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_LOCAL			},
		{ "interpolate_global",			"interpolate global variable",		NegativeCompileInterpolationCase::CASE_INTERPOLATE_GLOBAL			},
		{ "interpolate_constant",		"interpolate constant variable",	NegativeCompileInterpolationCase::CASE_INTERPOLATE_CONSTANT			},
	};

	// .sample_qualifier
	{
		tcu::TestCaseGroup* const sampleQualifierGroup = new tcu::TestCaseGroup(m_testCtx, "sample_qualifier", "Test sample qualifier");
		addChild(sampleQualifierGroup);

		for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
			sampleQualifierGroup->addChild(new SampleQualifierRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
	}

	// .interpolate_at_sample
	{
		tcu::TestCaseGroup* const interpolateAtSampleGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_sample", "Test interpolateAtSample");
		addChild(interpolateAtSampleGroup);

		// .static_sample_number
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "static_sample_number", "Test interpolateAtSample sample number");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtSampleRenderCase::INDEXING_STATIC));
		}

		// .dynamic_sample_number
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "dynamic_sample_number", "Test interpolateAtSample sample number");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleRenderCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtSampleRenderCase::INDEXING_DYNAMIC));
		}

		// .non_multisample_buffer
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "non_multisample_buffer", "Test interpolateAtSample with non-multisample buffers");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				if (targets[targetNdx].numSamples == 0)
					group->addChild(new SingleSampleInterpolateAtSampleCase(m_context, std::string("sample_0_").append(targets[targetNdx].name).c_str(), targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, SingleSampleInterpolateAtSampleCase::SAMPLE_0));

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				if (targets[targetNdx].numSamples == 0)
					group->addChild(new SingleSampleInterpolateAtSampleCase(m_context, std::string("sample_n_").append(targets[targetNdx].name).c_str(), targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, SingleSampleInterpolateAtSampleCase::SAMPLE_N));
		}

		// .centroid_qualifier
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "centroid_qualified", "Test interpolateAtSample with centroid qualified varying");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new CentroidQualifierAtSampleCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .at_sample_id
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "at_sample_id", "Test interpolateAtSample at current sample id");
			interpolateAtSampleGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSampleIDCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtSample negative tests");
			interpolateAtSampleGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_SAMPLE));
		}
	}

	// .interpolate_at_centroid
	{
		tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_centroid", "Test interpolateAtCentroid");
		addChild(methodGroup);

		// .consistency
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "consistency", "Test interpolateAtCentroid return value is consistent to centroid qualified value");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtCentroidCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtCentroidCase::TEST_CONSISTENCY));
		}

		// .array_element
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "array_element", "Test interpolateAtCentroid with array element");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtCentroidCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtCentroidCase::TEST_ARRAY_ELEMENT));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtCentroid negative tests");
			methodGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_CENTROID));
		}
	}

	// .interpolate_at_offset
	{
		static const struct TestConfig
		{
			const char*							name;
			InterpolateAtOffsetCase::TestType	type;
		} configs[] =
		{
			{ "no_qualifiers",		InterpolateAtOffsetCase::TEST_QUALIFIER_NONE		},
			{ "centroid_qualifier",	InterpolateAtOffsetCase::TEST_QUALIFIER_CENTROID	},
			{ "sample_qualifier",	InterpolateAtOffsetCase::TEST_QUALIFIER_SAMPLE		},
		};

		tcu::TestCaseGroup* const methodGroup = new tcu::TestCaseGroup(m_testCtx, "interpolate_at_offset", "Test interpolateAtOffset");
		addChild(methodGroup);

		// .no_qualifiers
		// .centroid_qualifier
		// .sample_qualifier
		for (int configNdx = 0; configNdx < DE_LENGTH_OF_ARRAY(configs); ++configNdx)
		{
			tcu::TestCaseGroup* const qualifierGroup = new tcu::TestCaseGroup(m_testCtx, configs[configNdx].name, "Test interpolateAtOffset with qualified/non-qualified varying");
			methodGroup->addChild(qualifierGroup);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				qualifierGroup->addChild(new InterpolateAtOffsetCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, configs[configNdx].type));
		}

		// .at_sample_position
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "at_sample_position", "Test interpolateAtOffset at sample position");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtSamplePositionCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target));
		}

		// .array_element
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "array_element", "Test interpolateAtOffset with array element");
			methodGroup->addChild(group);

			for (int targetNdx = 0; targetNdx < DE_LENGTH_OF_ARRAY(targets); ++targetNdx)
				group->addChild(new InterpolateAtOffsetCase(m_context, targets[targetNdx].name, targets[targetNdx].desc, targets[targetNdx].numSamples, targets[targetNdx].target, InterpolateAtOffsetCase::TEST_ARRAY_ELEMENT));
		}

		// .negative
		{
			tcu::TestCaseGroup* const group = new tcu::TestCaseGroup(m_testCtx, "negative", "interpolateAtOffset negative tests");
			methodGroup->addChild(group);

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(negativeCompileCases); ++ndx)
				group->addChild(new NegativeCompileInterpolationCase(m_context,
																	 negativeCompileCases[ndx].name,
																	 negativeCompileCases[ndx].description,
																	 negativeCompileCases[ndx].caseType,
																	 NegativeCompileInterpolationCase::INTERPOLATE_AT_OFFSET));
		}
	}
}